

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O3

string * __thiscall
higan::TimeStamp::FormatToString_abi_cxx11_(string *__return_storage_ptr__,TimeStamp *this)

{
  size_t sVar1;
  char local_38 [8];
  char buffer [32];
  
  FormatToBuffer(this,local_38,0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_38);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_38,local_38 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeStamp::FormatToString() const
{
	char buffer[32];
	FormatToBuffer(buffer, sizeof buffer);
	return buffer;
}